

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O0

Logs * __thiscall
deqp::gles3::Performance::ShaderCompilerCase::getLogs
          (Logs *__return_storage_ptr__,ShaderCompilerCase *this,
          ShadersAndProgram *shadersAndProgram)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  deUint32 in_ECX;
  string local_a0;
  string local_80;
  string local_50;
  undefined1 local_29;
  Performance *local_28;
  Functions *gl;
  ShadersAndProgram *shadersAndProgram_local;
  ShaderCompilerCase *this_local;
  Logs *result;
  
  gl = (Functions *)shadersAndProgram;
  shadersAndProgram_local = (ShadersAndProgram *)this;
  this_local = (ShaderCompilerCase *)__return_storage_ptr__;
  pRVar2 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  local_28 = (Performance *)CONCAT44(extraout_var,iVar1);
  local_29 = 0;
  Logs::Logs(__return_storage_ptr__);
  getShaderInfoLog_abi_cxx11_
            (&local_50,local_28,(Functions *)(ulong)*(uint *)&gl->activeShaderProgram,in_ECX);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  getShaderInfoLog_abi_cxx11_
            (&local_80,local_28,(Functions *)(ulong)*(uint *)((long)&gl->activeShaderProgram + 4),
             in_ECX);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->frag,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  getProgramInfoLog_abi_cxx11_
            (&local_a0,local_28,(Functions *)(ulong)*(uint *)&gl->activeTexture,in_ECX);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->link,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  return __return_storage_ptr__;
}

Assistant:

ShaderCompilerCase::Logs ShaderCompilerCase::getLogs (const ShadersAndProgram& shadersAndProgram) const
{
	const glw::Functions&	gl = m_context.getRenderContext().getFunctions();
	Logs					result;

	result.vert = getShaderInfoLog(gl, shadersAndProgram.vertShader);
	result.frag = getShaderInfoLog(gl, shadersAndProgram.fragShader);
	result.link = getProgramInfoLog(gl, shadersAndProgram.program);

	return result;
}